

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

Bounds3f * __thiscall pbrt::BilinearPatch::Bounds(BilinearPatch *this)

{
  BilinearPatchMesh *pBVar1;
  int iVar2;
  long in_RSI;
  Bounds3f *in_RDI;
  Point3f *p11;
  Point3f *p01;
  Point3f *p10;
  Point3f *p00;
  int *v;
  BilinearPatchMesh *mesh;
  Point3<float> *in_stack_ffffffffffffffa0;
  Point3<float> *in_stack_ffffffffffffffa8;
  Bounds3<float> *in_stack_ffffffffffffffb0;
  Bounds3<float> *b2;
  Bounds3<float> *b1;
  
  pBVar1 = GetMesh((BilinearPatch *)0x79515b);
  iVar2 = *(int *)(in_RSI + 4) << 2;
  b1 = (Bounds3<float> *)(pBVar1->p + pBVar1->vertexIndices[(long)iVar2 + 2]);
  b2 = (Bounds3<float> *)(pBVar1->p + pBVar1->vertexIndices[(long)iVar2 + 3]);
  Bounds3<float>::Bounds3
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  Bounds3<float>::Bounds3
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  Union<float>(b1,b2);
  return in_RDI;
}

Assistant:

Bounds3f BilinearPatch::Bounds() const {
    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    return Union(Bounds3f(p00, p01), Bounds3f(p10, p11));
}